

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<float,float,float,duckdb::BinaryStandardOperatorWrapper,duckdb::NextAfterOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined1 in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  float fVar5;
  bool in_stack_0000000f;
  float *result_data;
  float *rdata;
  float *ldata;
  undefined4 in_stack_ffffffffffffffb8;
  float fVar6;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar7;
  
  Vector::SetVectorType(in_RSI,(VectorType)((ulong)in_RDX >> 0x38));
  pfVar2 = ConstantVector::GetData<float>((Vector *)0x2088214);
  pfVar3 = ConstantVector::GetData<float>((Vector *)0x2088223);
  pfVar4 = ConstantVector::GetData<float>((Vector *)0x2088232);
  bVar1 = ConstantVector::IsNull((Vector *)0x2088241);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x208824f), !bVar1)) {
    uVar7 = CONCAT13(in_CL,(int3)in_stack_ffffffffffffffc4) & 0x1ffffff;
    fVar5 = *pfVar2;
    fVar6 = *pfVar3;
    ConstantVector::Validity(in_RDX);
    fVar5 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::NextAfterOperator,float,float,float>
                      (SUB81((ulong)pfVar3 >> 0x38,0),SUB84(pfVar3,0),(float)((ulong)pfVar4 >> 0x20)
                       ,(ValidityMask *)CONCAT44(uVar7,fVar6),
                       CONCAT44(fVar5,in_stack_ffffffffffffffb8));
    *pfVar4 = fVar5;
    return;
  }
  ConstantVector::SetNull((Vector *)result_data,in_stack_0000000f);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}